

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void ClearMapinfo(void)

{
  TArray<cluster_info_t,_cluster_info_t>::Clear(&wadclusterinfos);
  TArray<level_info_t,_level_info_t>::Clear(&wadlevelinfos);
  ClearEpisodes();
  TArray<FSkillInfo,_FSkillInfo>::Clear(&AllSkills);
  DefaultSkill = -1;
  DeinitIntermissions();
  level.info = (level_info_t *)0x0;
  return;
}

Assistant:

static void ClearMapinfo()
{
	wadclusterinfos.Clear();
	wadlevelinfos.Clear();
	ClearEpisodes();
	AllSkills.Clear();
	DefaultSkill = -1;
	DeinitIntermissions();
	level.info = NULL;
}